

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void ui_keymap_query(char *title,wchar_t row)

{
  _Bool _Var1;
  keypress *src;
  keypress kVar2;
  keypress kc;
  char tmp [1024];
  
  _Var1 = (player->opts).opt[1];
  prt(title,L'\r',L'\0');
  prt("Key: ",L'\x0e',L'\0');
  kVar2 = keymap_get_trigger();
  kc._8_4_ = kVar2._8_4_ & 0xff;
  kc.type = (int)kVar2._0_8_;
  kc.code = (int)((ulong)kVar2._0_8_ >> 0x20);
  src = keymap_find((uint)_Var1,kc);
  if (src != (keypress *)0x0) {
    keypress_to_text(tmp,0x400,src,false);
    prt("Found: ",L'\x0f',L'\0');
    Term_addstr(L'\xffffffff',L'\x01',tmp);
    prt("Press any key to continue.",L'\x11',L'\0');
    inkey();
    return;
  }
  prt("No keymap with that trigger.  Press any key to continue.",L'\x10',L'\0');
  inkey();
  return;
}

Assistant:

static void ui_keymap_query(const char *title, int row)
{
	char tmp[1024];
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;
	struct keypress c;
	const struct keypress *act;

	prt(title, 13, 0);
	prt("Key: ", 14, 0);
	
	/* Get a keymap trigger & mapping */
	c = keymap_get_trigger();
	act = keymap_find(mode, c);
	
	/* Keymap found? */
	if (!act) {
		/* Prompt */
		prt("No keymap with that trigger.  Press any key to continue.", 16, 0);
		inkey();
	} else {
		/* Analyze the current action */
		keypress_to_text(tmp, sizeof(tmp), act, false);
	
		/* Display the current action */
		prt("Found: ", 15, 0);
		Term_addstr(-1, COLOUR_WHITE, tmp);

		prt("Press any key to continue.", 17, 0);
		inkey();
	}
}